

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcShow.c
# Opt level: O2

void Abc_NodeShowCut(Abc_Obj_t *pNode,int nNodeSizeMax,int nConeSizeMax)

{
  void **ppvVar1;
  Abc_ManCut_t *p;
  Vec_Ptr_t *vLeaves;
  Vec_Ptr_t *pVVar2;
  Vec_Ptr_t *vVisited;
  void *Entry;
  char *pName;
  FILE *pFVar3;
  ulong uVar4;
  ulong uVar5;
  int i;
  Abc_Obj_t *pNode_local;
  char FileNameDot [200];
  
  pNode_local = pNode;
  if (pNode->pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcShow.c"
                  ,0xd7,"void Abc_NodeShowCut(Abc_Obj_t *, int, int)");
  }
  p = Abc_NtkManCutStart(nNodeSizeMax,nConeSizeMax,2,1000000000);
  vLeaves = Abc_NodeFindCut(p,pNode,1);
  pVVar2 = Abc_NtkManCutReadCutLarge(p);
  vVisited = Abc_NtkManCutReadVisited(p);
  Abc_NodeConeCollect(&pNode_local,1,pVVar2,vVisited,1);
  pVVar2 = Abc_NodeCollectTfoCands(p,pNode_local,vLeaves,1000000000);
  i = 0;
  do {
    if (pVVar2->nSize <= i) {
      pName = Abc_ObjName(pNode_local);
      Abc_ShowGetFileName(pName,FileNameDot);
      pFVar3 = fopen(FileNameDot,"w");
      if (pFVar3 == (FILE *)0x0) {
        fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",FileNameDot);
      }
      else {
        Vec_PtrPush(vLeaves,pNode_local);
        Io_WriteDotNtk(pNode_local->pNtk,vVisited,vLeaves,FileNameDot,0,0);
        Abc_NtkManCutStop(p);
        Abc_ShowFile(FileNameDot);
      }
      return;
    }
    Entry = Vec_PtrEntry(pVVar2,i);
    uVar4 = (ulong)(uint)vVisited->nSize;
    if (vVisited->nSize < 1) {
      uVar4 = 0;
    }
    uVar5 = 0;
    do {
      if (uVar4 == uVar5) {
        Vec_PtrPush(vVisited,Entry);
        break;
      }
      ppvVar1 = vVisited->pArray + uVar5;
      uVar5 = uVar5 + 1;
    } while (*ppvVar1 != Entry);
    i = i + 1;
  } while( true );
}

Assistant:

void Abc_NodeShowCut( Abc_Obj_t * pNode, int nNodeSizeMax, int nConeSizeMax )
{
    FILE * pFile;
    char FileNameDot[200];
    Abc_ManCut_t * p;
    Vec_Ptr_t * vCutSmall;
    Vec_Ptr_t * vCutLarge;
    Vec_Ptr_t * vInside;
    Vec_Ptr_t * vNodesTfo;
    Abc_Obj_t * pTemp;
    int i;

    assert( Abc_NtkIsStrash(pNode->pNtk) );

    // start the cut computation manager
    p = Abc_NtkManCutStart( nNodeSizeMax, nConeSizeMax, 2, ABC_INFINITY );
    // get the recovergence driven cut
    vCutSmall = Abc_NodeFindCut( p, pNode, 1 );
    // get the containing cut
    vCutLarge = Abc_NtkManCutReadCutLarge( p );
    // get the array for the inside nodes
    vInside = Abc_NtkManCutReadVisited( p );
    // get the inside nodes of the containing cone
    Abc_NodeConeCollect( &pNode, 1, vCutLarge, vInside, 1 );

    // add the nodes in the TFO 
    vNodesTfo = Abc_NodeCollectTfoCands( p, pNode, vCutSmall, ABC_INFINITY );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodesTfo, pTemp, i )
        Vec_PtrPushUnique( vInside, pTemp );

    // create the file name
    Abc_ShowGetFileName( Abc_ObjName(pNode), FileNameDot );
    // check that the file can be opened
    if ( (pFile = fopen( FileNameDot, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", FileNameDot );
        return;
    }
    // add the root node to the cone (for visualization)
    Vec_PtrPush( vCutSmall, pNode );
    // write the DOT file
    Io_WriteDotNtk( pNode->pNtk, vInside, vCutSmall, FileNameDot, 0, 0 );
    // stop the cut computation manager
    Abc_NtkManCutStop( p );

    // visualize the file 
    Abc_ShowFile( FileNameDot );
}